

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::chop
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t delta)

{
  ulong uVar1;
  bool bVar2;
  size_t length;
  
  uVar1 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  length = uVar1 - delta;
  if (uVar1 < delta || length == 0) {
    clear(this);
  }
  else {
    bVar2 = overrideLength(this,length);
    if (!bVar2) {
      return 0xffffffffffffffff;
    }
  }
  return (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
}

Assistant:

size_t
	chop(size_t delta) {
		if (this->m_length <= delta) {
			clear();
		} else {
			bool result = overrideLength(this->m_length - delta);
			if (!result)
				return -1;
		}

		return this->m_length;
	}